

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O2

RPCHelpMan * wallet::listtransactions(void)

{
  vector<RPCResult,_std::allocator<RPCResult>_> v1;
  vector<RPCResult,_std::allocator<RPCResult>_> v1_00;
  string name;
  string name_00;
  string name_01;
  string name_02;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  long lVar5;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  undefined4 in_stack_ffffffffffffeac8;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffeacc;
  undefined8 in_stack_ffffffffffffead0;
  undefined8 in_stack_ffffffffffffead8;
  undefined8 in_stack_ffffffffffffeae0;
  _Manager_type in_stack_ffffffffffffeae8;
  undefined8 in_stack_ffffffffffffeaf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffeaf8;
  pointer in_stack_ffffffffffffeb08;
  pointer pRVar7;
  pointer in_stack_ffffffffffffeb10;
  pointer pRVar8;
  pointer in_stack_ffffffffffffeb18;
  pointer pRVar9;
  _Vector_impl_data in_stack_ffffffffffffeb20;
  undefined1 in_stack_ffffffffffffeb38 [16];
  pointer in_stack_ffffffffffffeb48;
  pointer in_stack_ffffffffffffeb50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffeb58;
  pointer in_stack_ffffffffffffeb68;
  pointer pRVar10;
  pointer in_stack_ffffffffffffeb70;
  pointer pRVar11;
  pointer in_stack_ffffffffffffeb78;
  undefined8 in_stack_ffffffffffffeb80;
  pointer in_stack_ffffffffffffeb88;
  pointer in_stack_ffffffffffffeb90;
  pointer in_stack_ffffffffffffeb98;
  undefined8 in_stack_ffffffffffffeba0;
  pointer in_stack_ffffffffffffeba8;
  allocator<char> local_143a;
  allocator<char> local_1439;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1438;
  allocator<char> local_1419;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1418;
  allocator<char> local_13fa;
  allocator<char> local_13f9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13f8;
  allocator<char> local_13da;
  allocator<char> local_13d9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13d8;
  allocator<char> local_13ba;
  allocator<char> local_13b9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13b8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_13a0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1388;
  allocator<char> local_136a;
  allocator<char> local_1369;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1368;
  allocator<char> local_134a;
  allocator<char> local_1349;
  RPCResults local_1348;
  allocator_type local_132d;
  allocator<char> local_132c;
  allocator<char> local_132b;
  allocator<char> local_132a;
  allocator<char> local_1329;
  int local_1328;
  allocator<char> local_1322;
  allocator<char> local_1321;
  int local_1320;
  allocator<char> local_131b;
  allocator<char> local_131a;
  allocator<char> local_1319;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1318;
  allocator<char> local_12fa;
  allocator<char> local_12f9;
  string local_12f8;
  string local_12d8;
  string local_12b8;
  string local_1298;
  string local_1278;
  string local_1258;
  string local_1238;
  string local_1218;
  string local_11f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1158;
  char *local_1138;
  size_type local_1130;
  char local_1128 [8];
  undefined8 uStack_1120;
  string local_1118 [32];
  string local_10f8 [32];
  RPCResult local_10d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1030;
  string local_1010 [32];
  string local_ff0 [32];
  string local_fd0 [32];
  string local_fb0 [32];
  string local_f90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f50;
  string local_f30 [32];
  string local_f10 [32];
  string local_ef0 [32];
  string local_ed0 [32];
  string local_eb0 [32];
  string local_e90 [32];
  string local_e70 [32];
  RPCResult local_e50 [4];
  RPCResult local_c30;
  RPCResult local_ba8;
  RPCResult local_b20;
  string local_a98 [32];
  string local_a78 [32];
  RPCResult local_a58;
  string local_9d0 [32];
  string local_9b0 [32];
  RPCResult local_990;
  RPCArgOptions local_908;
  string local_8c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_880;
  string local_820 [32];
  RPCArgOptions local_800;
  string local_7b8 [32];
  UniValue local_798;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_740;
  string local_6e0 [32];
  RPCArgOptions local_6c0;
  string local_678 [32];
  UniValue local_658;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_600;
  string local_5a0 [32];
  RPCArgOptions local_580;
  string local_538 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_518;
  undefined1 local_4c0;
  string local_4b8 [32];
  RPCArg local_498 [4];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1030._M_dataplus._M_p = (pointer)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"listtransactions",&local_12f9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "\nIf a label name is provided, this will return only incoming transactions paying to addresses with the specified label.\n\nReturns up to \'count\' most recent transactions skipping the first \'from\' transactions.\n"
             ,&local_12fa);
  std::__cxx11::string::string<std::allocator<char>>(local_4b8,"label|dummy",&local_1319);
  local_518._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_4c0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_538,
             "If set, should be a valid label name to return only incoming transactions\nwith the specified label, or \"*\" to disable filtering and return all transactions."
             ,&local_131a);
  local_580.oneline_description._M_dataplus._M_p = (pointer)&local_580.oneline_description.field_2;
  local_580.skip_type_check = false;
  local_580.oneline_description._M_string_length = 0;
  local_580.oneline_description.field_2._M_local_buf[0] = '\0';
  local_580.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_580.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_580.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_580.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_580._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeacc;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeac8;
  name._M_string_length = in_stack_ffffffffffffead0;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffead8;
  name.field_2._8_8_ = in_stack_ffffffffffffeae0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffeaf0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffeae8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffeaf8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffeb08;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffeb10;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffeb18;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffeb20._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffeb20._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffeb20._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffeb38;
  description_10._M_string_length = (size_type)in_stack_ffffffffffffeb50;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb48;
  description_10.field_2 = in_stack_ffffffffffffeb58;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb70;
  opts._0_8_ = in_stack_ffffffffffffeb68;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeb78;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffeb80;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffeb88;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffeb90;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffeb98;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeba0;
  opts._64_8_ = in_stack_ffffffffffffeba8;
  RPCArg::RPCArg(local_498,name,(Type)local_4b8,fallback,description_10,opts);
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"count",&local_131b);
  local_1320 = 10;
  UniValue::UniValue<int,_int,_true>(&local_658,&local_1320);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_600,&local_658);
  std::__cxx11::string::string<std::allocator<char>>
            (local_678,"The number of transactions to return",&local_1321);
  local_6c0.oneline_description._M_dataplus._M_p = (pointer)&local_6c0.oneline_description.field_2;
  local_6c0.skip_type_check = false;
  local_6c0.oneline_description._M_string_length = 0;
  local_6c0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_6c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_6c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_6c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_6c0._58_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeacc;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeac8;
  name_00._M_string_length = in_stack_ffffffffffffead0;
  name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffead8;
  name_00.field_2._8_8_ = in_stack_ffffffffffffeae0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffeaf0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffeae8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffeaf8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffeb08;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffeb10;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffeb18;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffeb20._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffeb20._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffeb20._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffeb38;
  description_11._M_string_length = (size_type)in_stack_ffffffffffffeb50;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb48;
  description_11.field_2 = in_stack_ffffffffffffeb58;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb70;
  opts_00._0_8_ = in_stack_ffffffffffffeb68;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeb78;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffeb80;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffeb88;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffeb90;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffeb98;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeba0;
  opts_00._64_8_ = in_stack_ffffffffffffeba8;
  RPCArg::RPCArg(local_498 + 1,name_00,(Type)local_5a0,fallback_00,description_11,opts_00);
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,"skip",&local_1322);
  local_1328 = 0;
  UniValue::UniValue<int,_int,_true>(&local_798,&local_1328);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_740,&local_798);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7b8,"The number of transactions to skip",&local_1329);
  local_800.oneline_description._M_dataplus._M_p = (pointer)&local_800.oneline_description.field_2;
  local_800.skip_type_check = false;
  local_800.oneline_description._M_string_length = 0;
  local_800.oneline_description.field_2._M_local_buf[0] = '\0';
  local_800.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_800.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_800.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_800.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_800._58_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeacc;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeac8;
  name_01._M_string_length = in_stack_ffffffffffffead0;
  name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffead8;
  name_01.field_2._8_8_ = in_stack_ffffffffffffeae0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffeaf0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffeae8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffeaf8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffeb08;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffeb10;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffeb18;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffeb20._M_start;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffeb20._M_finish;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffeb20._M_end_of_storage;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffeb38;
  description_12._M_string_length = (size_type)in_stack_ffffffffffffeb50;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb48;
  description_12.field_2 = in_stack_ffffffffffffeb58;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb70;
  opts_01._0_8_ = in_stack_ffffffffffffeb68;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeb78;
  opts_01.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffeb80;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffeb88;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffeb90;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffeb98;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeba0;
  opts_01._64_8_ = in_stack_ffffffffffffeba8;
  RPCArg::RPCArg(local_498 + 2,name_01,(Type)local_6e0,fallback_01,description_12,opts_01);
  std::__cxx11::string::string<std::allocator<char>>(local_820,"include_watchonly",&local_132a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a0,"true for watch-only wallets, otherwise false",&local_132b);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_880,&local_8a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8c0,"Include transactions to watch-only addresses (see \'importaddress\')",
             &local_132c);
  local_908.oneline_description._M_dataplus._M_p = (pointer)&local_908.oneline_description.field_2;
  local_908.skip_type_check = false;
  local_908.oneline_description._M_string_length = 0;
  local_908.oneline_description.field_2._M_local_buf[0] = '\0';
  local_908.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_908.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_908.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_908.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_908._58_8_ = 0;
  name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeacc;
  name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffeac8;
  name_02._M_string_length = in_stack_ffffffffffffead0;
  name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffead8;
  name_02.field_2._8_8_ = in_stack_ffffffffffffeae0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffeaf0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffeae8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffeaf8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffeb08;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffeb10;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffeb18;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffeb20._M_start;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffeb20._M_finish;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffeb20._M_end_of_storage;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_ffffffffffffeb38;
  description_13._M_string_length = (size_type)in_stack_ffffffffffffeb50;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb48;
  description_13.field_2 = in_stack_ffffffffffffeb58;
  opts_02.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb70;
  opts_02._0_8_ = in_stack_ffffffffffffeb68;
  opts_02.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeb78;
  opts_02.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffeb80;
  opts_02.oneline_description.field_2._8_8_ = in_stack_ffffffffffffeb88;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffeb90;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffeb98;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffeba0;
  opts_02._64_8_ = in_stack_ffffffffffffeba8;
  RPCArg::RPCArg(local_498 + 3,name_02,(Type)local_820,fallback_02,description_13,opts_02);
  __l._M_len = 4;
  __l._M_array = local_498;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1318,__l,&local_132d);
  std::__cxx11::string::string<std::allocator<char>>(local_9b0,"",&local_1349);
  std::__cxx11::string::string<std::allocator<char>>(local_9d0,"",&local_134a);
  std::__cxx11::string::string<std::allocator<char>>(local_a78,"",&local_1369);
  std::__cxx11::string::string<std::allocator<char>>(local_a98,"",&local_136a);
  std::__cxx11::string::string<std::allocator<char>>(local_e70,"involvesWatchonly",&local_13b9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e90,"Only returns true if imported addresses were involved in transaction.",
             &local_13ba);
  local_13d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar1._4_8_ = in_stack_ffffffffffffead0;
  auVar1._0_4_ = in_stack_ffffffffffffeacc;
  auVar1._12_8_ = in_stack_ffffffffffffead8;
  auVar1._20_8_ = in_stack_ffffffffffffeae0;
  auVar1._28_4_ = 0;
  description._M_string_length = in_stack_ffffffffffffeaf0;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeae8;
  description.field_2 = in_stack_ffffffffffffeaf8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffeb10;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffeb08;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (local_e50,BOOL,(string)(auVar1 << 0x20),SUB81(local_e70,0),description,inner,true);
  std::__cxx11::string::string<std::allocator<char>>(local_eb0,"address",&local_13d9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ed0,
             "The bitcoin address of the transaction (not returned if the output does not have an address, e.g. OP_RETURN null data)."
             ,&local_13da);
  local_13f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = 0;
  auVar2._4_8_ = in_stack_ffffffffffffead0;
  auVar2._0_4_ = in_stack_ffffffffffffeacc;
  auVar2._12_8_ = in_stack_ffffffffffffead8;
  auVar2._20_8_ = in_stack_ffffffffffffeae0;
  auVar2._28_4_ = 0;
  description_00._M_string_length = in_stack_ffffffffffffeaf0;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeae8;
  description_00.field_2 = in_stack_ffffffffffffeaf8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (local_e50 + 1,STR,(string)(auVar2 << 0x20),SUB81(local_eb0,0),description_00,inner_00,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_ef0,"category",&local_13f9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f10,
             "The transaction category.\n\"send\"                  Transactions sent.\n\"receive\"               Non-coinbase transactions received.\n\"generate\"              Coinbase transactions received with more than 100 confirmations.\n\"immature\"              Coinbase transactions received with 100 or fewer confirmations.\n\"orphan\"                Orphaned coinbase transactions received."
             ,&local_13fa);
  local_1418.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1418.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1418.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeacc;
  m_key_name._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name._M_string_length = in_stack_ffffffffffffead0;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffead8;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffeae0;
  description_01._M_string_length = in_stack_ffffffffffffeaf0;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeae8;
  description_01.field_2 = in_stack_ffffffffffffeaf8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult(local_e50 + 2,STR,m_key_name,description_01,inner_01,SUB81(local_ef0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_f30,"amount",&local_1419);
  std::operator+(&local_f70,"The amount in ",&::CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_f50,&local_f70,
                 ". This is negative for the \'send\' category, and is positive\nfor all other categories"
                );
  local_1438.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1438.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1438.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeacc;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_00._M_string_length = in_stack_ffffffffffffead0;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffead8;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffeae0;
  description_02._M_string_length = in_stack_ffffffffffffeaf0;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeae8;
  description_02.field_2 = in_stack_ffffffffffffeaf8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (local_e50 + 3,STR_AMOUNT,m_key_name_00,description_02,inner_02,SUB81(local_f30,0));
  std::__cxx11::string::string<std::allocator<char>>(local_f90,"label",&local_1439);
  std::__cxx11::string::string<std::allocator<char>>
            (local_fb0,"A comment for the address/transaction, if any",&local_143a);
  uVar6 = 0;
  auVar3._4_8_ = in_stack_ffffffffffffead0;
  auVar3._0_4_ = in_stack_ffffffffffffeacc;
  auVar3._12_8_ = in_stack_ffffffffffffead8;
  auVar3._20_8_ = in_stack_ffffffffffffeae0;
  auVar3._28_4_ = 0;
  description_03._M_string_length = in_stack_ffffffffffffeaf0;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeae8;
  description_03.field_2 = in_stack_ffffffffffffeaf8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (&local_c30,STR,(string)(auVar3 << 0x20),SUB81(local_f90,0),description_03,inner_03,true
            );
  std::__cxx11::string::string<std::allocator<char>>
            (local_fd0,"vout",(allocator<char> *)&stack0xffffffffffffeba7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ff0,"the vout value",(allocator<char> *)&stack0xffffffffffffeba6);
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeacc;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_01._M_string_length = in_stack_ffffffffffffead0;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffead8;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffeae0;
  description_04._M_string_length = in_stack_ffffffffffffeaf0;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeae8;
  description_04.field_2 = in_stack_ffffffffffffeaf8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult(&local_ba8,NUM,m_key_name_01,description_04,inner_04,SUB81(local_fd0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1010,"fee",(allocator<char> *)&stack0xffffffffffffeb87);
  std::operator+(&local_1050,"The amount of the fee in ",&::CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_1030,&local_1050,
                 ". This is negative and only available for the\n\'send\' category of transactions."
                );
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  uVar6 = 0;
  auVar4._4_8_ = in_stack_ffffffffffffead0;
  auVar4._0_4_ = in_stack_ffffffffffffeacc;
  auVar4._12_8_ = in_stack_ffffffffffffead8;
  auVar4._20_8_ = in_stack_ffffffffffffeae0;
  auVar4._28_4_ = 0;
  description_05._M_string_length = in_stack_ffffffffffffeaf0;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeae8;
  description_05.field_2 = in_stack_ffffffffffffeaf8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffeb10;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffeb08;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffeb18;
  RPCResult::RPCResult
            (&local_b20,STR_AMOUNT,(string)(auVar4 << 0x20),SUB81(local_1010,0),description_05,
             inner_05,true);
  __l_00._M_len = 7;
  __l_00._M_array = local_e50;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_13b8,__l_00,(allocator_type *)&stack0xffffffffffffeb67);
  TransactionDescriptionString();
  v1.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = in_stack_ffffffffffffeacc;
  v1.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = uVar6;
  v1.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffead0;
  v1.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffead8;
  Cat<std::vector<RPCResult,std::allocator<RPCResult>>>(&local_13a0,v1,&local_13b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_10f8,"abandoned",(allocator<char> *)&stack0xffffffffffffeb2f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1118,"\'true\' if the transaction has been abandoned (inputs are respendable).",
             (allocator<char> *)&stack0xffffffffffffeb2e);
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeacc;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_02._M_string_length = in_stack_ffffffffffffead0;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffead8;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffeae0;
  description_06._M_string_length = in_stack_ffffffffffffeaf0;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeae8;
  description_06.field_2 = in_stack_ffffffffffffeaf8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_10d8,BOOL,m_key_name_02,description_06,inner_06,SUB81(local_10f8,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_10d8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb30,__l_01,
             (allocator_type *)&stack0xffffffffffffeb07);
  v1_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = in_stack_ffffffffffffeacc;
  v1_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = uVar6;
  v1_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffead0;
  v1_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffead8;
  Cat<std::vector<RPCResult,std::allocator<RPCResult>>>(&local_1388,v1_00,&local_13a0);
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeacc;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_03._M_string_length = in_stack_ffffffffffffead0;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffead8;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffeae0;
  description_07._M_string_length = in_stack_ffffffffffffeaf0;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeae8;
  description_07.field_2._M_local_buf = in_stack_ffffffffffffeaf8._M_local_buf;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar7;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar9;
  RPCResult::RPCResult(&local_a58,OBJ,m_key_name_03,description_07,inner_07,SUB81(local_a78,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_a58;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1368,__l_02,(allocator_type *)&stack0xffffffffffffeb06);
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffeacc;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_04._M_string_length = in_stack_ffffffffffffead0;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffead8;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffeae0;
  description_08._M_string_length = in_stack_ffffffffffffeaf0;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeae8;
  description_08.field_2 = in_stack_ffffffffffffeaf8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar7;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar9;
  RPCResult::RPCResult(&local_990,ARR,m_key_name_04,description_08,inner_08,SUB81(local_9b0,0));
  result._4_4_ = in_stack_ffffffffffffeacc;
  result.m_type = uVar6;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffead0;
  result.m_key_name._M_string_length = in_stack_ffffffffffffead8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffeae0;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffeae8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffeaf0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffeaf8;
  result._64_8_ = pRVar7;
  result.m_description._M_dataplus._M_p = (pointer)pRVar8;
  result.m_description._M_string_length = (size_type)pRVar9;
  result._88_24_ = in_stack_ffffffffffffeb20;
  result.m_cond._8_16_ = in_stack_ffffffffffffeb38;
  result.m_cond.field_2._8_8_ = in_stack_ffffffffffffeb48;
  RPCResults::RPCResults(&local_1348,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1218,"listtransactions",(allocator<char> *)&stack0xffffffffffffeb05);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1238,"",(allocator<char> *)&stack0xffffffffffffeb04);
  HelpExampleCli(&local_11f8,&local_1218,&local_1238);
  std::operator+(&local_11d8,"\nList the most recent 10 transactions in the systems\n",&local_11f8);
  std::operator+(&local_11b8,&local_11d8,"\nList transactions 100 to 120\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1278,"listtransactions",(allocator<char> *)&stack0xffffffffffffeb03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1298,"\"*\" 20 100",(allocator<char> *)&stack0xffffffffffffeb02);
  HelpExampleCli(&local_1258,&local_1278,&local_1298);
  std::operator+(&local_1198,&local_11b8,&local_1258);
  std::operator+(&local_1178,&local_1198,"\nAs a JSON-RPC call\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12d8,"listtransactions",(allocator<char> *)&stack0xffffffffffffeb01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12f8,"\"*\", 20, 100",(allocator<char> *)&stack0xffffffffffffeb00);
  HelpExampleRpc(&local_12b8,&local_12d8,&local_12f8);
  std::operator+(&local_1158,&local_1178,&local_12b8);
  local_1138 = local_1128;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1158._M_dataplus._M_p == &local_1158.field_2) {
    uStack_1120 = local_1158.field_2._8_8_;
  }
  else {
    local_1138 = local_1158._M_dataplus._M_p;
  }
  local_1130 = local_1158._M_string_length;
  local_1158._M_string_length = 0;
  local_1158.field_2._M_local_buf[0] = '\0';
  description_09._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/transactions.cpp:486:9)>
       ::_M_invoke;
  description_09._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/transactions.cpp:486:9)>
                ::_M_manager;
  description_09.field_2 = in_stack_ffffffffffffeaf8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar7;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar9;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeb48;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeb38._0_8_;
  examples.m_examples._M_string_length = in_stack_ffffffffffffeb38._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffeb50;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar10;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_ffffffffffffeb58._M_local_buf;
  fun._M_invoker = (_Invoker_type)pRVar11;
  local_1158._M_dataplus._M_p = (pointer)&local_1158.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_ffffffffffffead0,&stack0xffffffffffffead8)),
             description_09,args,(RPCResults)in_stack_ffffffffffffeb20,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffead8);
  std::__cxx11::string::~string((string *)&local_1138);
  std::__cxx11::string::~string((string *)&local_1158);
  std::__cxx11::string::~string((string *)&local_12b8);
  std::__cxx11::string::~string((string *)&local_12f8);
  std::__cxx11::string::~string((string *)&local_12d8);
  std::__cxx11::string::~string((string *)&local_1178);
  std::__cxx11::string::~string((string *)&local_1198);
  std::__cxx11::string::~string((string *)&local_1258);
  std::__cxx11::string::~string((string *)&local_1298);
  std::__cxx11::string::~string((string *)&local_1278);
  std::__cxx11::string::~string((string *)&local_11b8);
  std::__cxx11::string::~string((string *)&local_11d8);
  std::__cxx11::string::~string((string *)&local_11f8);
  std::__cxx11::string::~string((string *)&local_1238);
  std::__cxx11::string::~string((string *)&local_1218);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1348.m_results);
  RPCResult::~RPCResult(&local_990);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1368);
  RPCResult::~RPCResult(&local_a58);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1388);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb30);
  RPCResult::~RPCResult(&local_10d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb08);
  std::__cxx11::string::~string(local_1118);
  std::__cxx11::string::~string(local_10f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13b8);
  lVar5 = 0x330;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_e50[0].m_type + lVar5));
    lVar5 = lVar5 + -0x88;
  } while (lVar5 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb68);
  std::__cxx11::string::~string((string *)&local_1030);
  std::__cxx11::string::~string((string *)&local_1050);
  std::__cxx11::string::~string(local_1010);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeb88);
  std::__cxx11::string::~string(local_ff0);
  std::__cxx11::string::~string(local_fd0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeba8);
  std::__cxx11::string::~string(local_fb0);
  std::__cxx11::string::~string(local_f90);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1438);
  std::__cxx11::string::~string((string *)&local_f50);
  std::__cxx11::string::~string((string *)&local_f70);
  std::__cxx11::string::~string(local_f30);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1418);
  std::__cxx11::string::~string(local_f10);
  std::__cxx11::string::~string(local_ef0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13f8);
  std::__cxx11::string::~string(local_ed0);
  std::__cxx11::string::~string(local_eb0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_13d8);
  std::__cxx11::string::~string(local_e90);
  std::__cxx11::string::~string(local_e70);
  std::__cxx11::string::~string(local_a98);
  std::__cxx11::string::~string(local_a78);
  std::__cxx11::string::~string(local_9d0);
  std::__cxx11::string::~string(local_9b0);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1318);
  lVar5 = 0x318;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_498[0].m_names._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x108;
  } while (lVar5 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_908);
  std::__cxx11::string::~string(local_8c0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_880);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::__cxx11::string::~string(local_820);
  RPCArgOptions::~RPCArgOptions(&local_800);
  std::__cxx11::string::~string(local_7b8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_740);
  UniValue::~UniValue(&local_798);
  std::__cxx11::string::~string(local_6e0);
  RPCArgOptions::~RPCArgOptions(&local_6c0);
  std::__cxx11::string::~string(local_678);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_600);
  UniValue::~UniValue(&local_658);
  std::__cxx11::string::~string(local_5a0);
  RPCArgOptions::~RPCArgOptions(&local_580);
  std::__cxx11::string::~string(local_538);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_518._M_first);
  std::__cxx11::string::~string(local_4b8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listtransactions()
{
    return RPCHelpMan{"listtransactions",
                "\nIf a label name is provided, this will return only incoming transactions paying to addresses with the specified label.\n"
                "\nReturns up to 'count' most recent transactions skipping the first 'from' transactions.\n",
                {
                    {"label|dummy", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "If set, should be a valid label name to return only incoming transactions\n"
                          "with the specified label, or \"*\" to disable filtering and return all transactions."},
                    {"count", RPCArg::Type::NUM, RPCArg::Default{10}, "The number of transactions to return"},
                    {"skip", RPCArg::Type::NUM, RPCArg::Default{0}, "The number of transactions to skip"},
                    {"include_watchonly", RPCArg::Type::BOOL, RPCArg::DefaultHint{"true for watch-only wallets, otherwise false"}, "Include transactions to watch-only addresses (see 'importaddress')"},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "", Cat(Cat<std::vector<RPCResult>>(
                        {
                            {RPCResult::Type::BOOL, "involvesWatchonly", /*optional=*/true, "Only returns true if imported addresses were involved in transaction."},
                            {RPCResult::Type::STR, "address",  /*optional=*/true, "The bitcoin address of the transaction (not returned if the output does not have an address, e.g. OP_RETURN null data)."},
                            {RPCResult::Type::STR, "category", "The transaction category.\n"
                                "\"send\"                  Transactions sent.\n"
                                "\"receive\"               Non-coinbase transactions received.\n"
                                "\"generate\"              Coinbase transactions received with more than 100 confirmations.\n"
                                "\"immature\"              Coinbase transactions received with 100 or fewer confirmations.\n"
                                "\"orphan\"                Orphaned coinbase transactions received."},
                            {RPCResult::Type::STR_AMOUNT, "amount", "The amount in " + CURRENCY_UNIT + ". This is negative for the 'send' category, and is positive\n"
                                "for all other categories"},
                            {RPCResult::Type::STR, "label", /*optional=*/true, "A comment for the address/transaction, if any"},
                            {RPCResult::Type::NUM, "vout", "the vout value"},
                            {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The amount of the fee in " + CURRENCY_UNIT + ". This is negative and only available for the\n"
                                 "'send' category of transactions."},
                        },
                        TransactionDescriptionString()),
                        {
                            {RPCResult::Type::BOOL, "abandoned", "'true' if the transaction has been abandoned (inputs are respendable)."},
                        })},
                    }
                },
                RPCExamples{
            "\nList the most recent 10 transactions in the systems\n"
            + HelpExampleCli("listtransactions", "") +
            "\nList transactions 100 to 120\n"
            + HelpExampleCli("listtransactions", "\"*\" 20 100") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("listtransactions", "\"*\", 20, 100")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    std::optional<std::string> filter_label;
    if (!request.params[0].isNull() && request.params[0].get_str() != "*") {
        filter_label.emplace(LabelFromValue(request.params[0]));
        if (filter_label.value().empty()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Label argument must be a valid label name or \"*\".");
        }
    }
    int nCount = 10;
    if (!request.params[1].isNull())
        nCount = request.params[1].getInt<int>();
    int nFrom = 0;
    if (!request.params[2].isNull())
        nFrom = request.params[2].getInt<int>();
    isminefilter filter = ISMINE_SPENDABLE;

    if (ParseIncludeWatchonly(request.params[3], *pwallet)) {
        filter |= ISMINE_WATCH_ONLY;
    }

    if (nCount < 0)
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Negative count");
    if (nFrom < 0)
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Negative from");

    std::vector<UniValue> ret;
    {
        LOCK(pwallet->cs_wallet);

        const CWallet::TxItems & txOrdered = pwallet->wtxOrdered;

        // iterate backwards until we have nCount items to return:
        for (CWallet::TxItems::const_reverse_iterator it = txOrdered.rbegin(); it != txOrdered.rend(); ++it)
        {
            CWalletTx *const pwtx = (*it).second;
            ListTransactions(*pwallet, *pwtx, 0, true, ret, filter, filter_label);
            if ((int)ret.size() >= (nCount+nFrom)) break;
        }
    }

    // ret is newest to oldest

    if (nFrom > (int)ret.size())
        nFrom = ret.size();
    if ((nFrom + nCount) > (int)ret.size())
        nCount = ret.size() - nFrom;

    auto txs_rev_it{std::make_move_iterator(ret.rend())};
    UniValue result{UniValue::VARR};
    result.push_backV(txs_rev_it - nFrom - nCount, txs_rev_it - nFrom); // Return oldest to newest
    return result;
},
    };
}